

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

enable_if_t<IteratorRange<const_double_(*)[3],_double[3]>::is_container>
gnuplotio::
deref_and_print<gnuplotio::IteratorRange<double_const(*)[3],double[3]>,gnuplotio::ModeBinfmt>
          (ostream *stream,IteratorRange<const_double_(*)[3],_double[3]> *arg)

{
  double *pdVar1;
  plotting_empty_container *this;
  subiter_type subrange;
  subiter_type local_28;
  
  if (arg->it == arg->end) {
    this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
    plotting_empty_container::plotting_empty_container(this);
  }
  else {
    local_28 = IteratorRange<const_double_(*)[3],_double[3]>::deref_subiter(arg);
    if (local_28.it != local_28.end) {
      if (local_28.it != local_28.end) {
        do {
          IteratorRange<const_double_*,_double>::deref(&local_28);
          std::__ostream_insert<char,std::char_traits<char>>(stream,"%double",7);
          pdVar1 = local_28.it + 1;
          local_28.it = pdVar1;
        } while (pdVar1 != local_28.end);
      }
      return;
    }
    this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
    plotting_empty_container::plotting_empty_container(this);
  }
  __cxa_throw(this,&plotting_empty_container::typeinfo,std::length_error::~length_error);
}

Assistant:

bool is_end() const { return it == end; }